

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O0

void __thiscall
tcu::TestPackageRegistry::registerPackage
          (TestPackageRegistry *this,char *name,TestPackageCreateFunc createFunc)

{
  TestPackageCreateFunc __s;
  PackageInfo *this_00;
  allocator<char> local_49;
  string local_48;
  PackageInfo *local_28;
  TestPackageCreateFunc local_20;
  TestPackageCreateFunc createFunc_local;
  char *name_local;
  TestPackageRegistry *this_local;
  
  local_20 = createFunc;
  createFunc_local = (TestPackageCreateFunc)name;
  name_local = (char *)this;
  this_00 = (PackageInfo *)operator_new(0x28);
  __s = createFunc_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,(char *)__s,&local_49);
  PackageInfo::PackageInfo(this_00,&local_48,local_20);
  local_28 = this_00;
  std::
  vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
  ::push_back(&this->m_packageInfos,&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void TestPackageRegistry::registerPackage (const char* name, TestPackageCreateFunc createFunc)
{
	DE_ASSERT(getPackageInfoByName(name) == DE_NULL);
	m_packageInfos.push_back(new PackageInfo(name, createFunc));
}